

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::DefinitionSymbol::DefinitionSymbol
          (DefinitionSymbol *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          bool cellDefine,optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view arg;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  SourceRange sourceRange;
  SourceRange SVar1;
  bool bVar2;
  DefinitionKind DVar3;
  VariableLifetime VVar4;
  ModuleHeaderSyntax *pMVar5;
  SourceLibrary *pSVar6;
  Compilation *pCVar7;
  SourceLocation this_00;
  reference ppMVar8;
  ModportDeclarationSyntax *pMVar9;
  Scope *in_RSI;
  Symbol *in_RDI;
  SyntaxNode *in_R8;
  undefined8 in_R9;
  iterator iVar10;
  iterator iVar11;
  string_view sVar12;
  undefined4 in_stack_00000008;
  byte in_stack_00000010;
  undefined8 in_stack_00000018;
  size_t in_stack_00000020;
  bool isLocal;
  not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> declaration;
  ModportItemSyntax *item;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range4;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  bool first;
  bool hasPortParams;
  SyntaxNode *externMod;
  Compilation *comp;
  ModuleHeaderSyntax *header;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  SymbolIndex in_stack_fffffffffffffaf4;
  Scope *in_stack_fffffffffffffaf8;
  Symbol *in_stack_fffffffffffffb00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb08;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  Symbol *in_stack_fffffffffffffb20;
  pointer in_stack_fffffffffffffb28;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  SyntaxNode *in_stack_fffffffffffffb40;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_stack_fffffffffffffb50;
  TimeUnitsDeclarationSyntax *in_stack_fffffffffffffb58;
  Scope *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb6c;
  Symbol *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb80;
  Symbol *in_stack_fffffffffffffb88;
  TimeUnitsDeclarationSyntax *in_stack_fffffffffffffb90;
  Symbol *in_stack_fffffffffffffb98;
  TimeScale *in_stack_fffffffffffffba0;
  ModportItemSyntax *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  size_t in_stack_fffffffffffffbc0;
  ParentList *in_stack_fffffffffffffbc8;
  size_t in_stack_fffffffffffffbd0;
  ParentList *in_stack_fffffffffffffbd8;
  bool local_3f9;
  Scope *in_stack_fffffffffffffc28;
  SourceLocation in_stack_fffffffffffffc30;
  DiagCode code;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_2d8;
  string_view local_2c0;
  ModportItemSyntax *local_2b0;
  iterator local_2a8;
  iterator local_298;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *local_288;
  MemberSyntax *local_280;
  MemberSyntax **local_278;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_270;
  SyntaxNode **local_268;
  undefined1 local_22a;
  byte local_229;
  size_t local_228;
  char *pcStack_220;
  SourceRange local_210;
  undefined4 local_1fc;
  size_t local_1f8;
  char *pcStack_1f0;
  SourceLocation local_1e8;
  Compilation *local_1e0;
  ModuleHeaderSyntax *local_1d8;
  undefined4 local_1cc;
  undefined8 local_1c8;
  Info *pIStack_1c0;
  _Optional_payload_base<slang::ast::VariableLifetime> local_1b8;
  SourceLocation local_190;
  string_view local_188;
  byte local_171;
  undefined8 local_170;
  SyntaxNode *local_168;
  Scope *local_160;
  undefined4 local_14d;
  undefined1 local_149;
  LookupLocation local_148;
  string_view *local_138;
  Symbol *local_130;
  string_view *local_128;
  Symbol *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  size_t local_88;
  optional<slang::SourceRange> *local_80;
  TimeUnitsDeclarationSyntax *local_78;
  string_view *local_70;
  Symbol *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  optional<slang::SourceRange> *local_20;
  size_t local_18;
  TimeUnitsDeclarationSyntax *local_10;
  Symbol *local_8;
  
  local_149 = (undefined1)((ulong)in_stack_00000018 >> 0x20);
  local_14d = (undefined4)in_stack_00000018;
  local_171 = in_stack_00000010 & 1;
  local_170 = in_R9;
  local_168 = in_R8;
  local_160 = in_RSI;
  not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xa57d55);
  local_188 = parsing::Token::valueText((Token *)in_stack_fffffffffffffb00);
  pMVar5 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xa57d82);
  local_190 = parsing::Token::location(&pMVar5->name);
  Symbol::Symbol(in_RDI,Definition,local_188,local_190);
  *(undefined8 *)(in_RDI + 1) = local_170;
  *(undefined4 *)&in_RDI[1].name._M_str = in_stack_00000008;
  *(byte *)((long)&in_RDI[1].name._M_str + 4) = local_171 & 1;
  std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0xa57df3);
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL>::SmallVector
            ((SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *)0xa57e0c);
  boost::unordered::
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_flat_set
            ((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)in_stack_fffffffffffffb10);
  std::vector<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>::vector
            ((vector<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>
              *)0xa57e46);
  in_RDI[0xb].name._M_len = in_stack_00000020;
  pSVar6 = getLibForDef(in_stack_fffffffffffffaf8,
                        (SyntaxTree *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0))
  ;
  in_RDI[0xb].name._M_str = (char *)pSVar6;
  in_RDI[0xb].parentScope = (Scope *)0x0;
  LookupLocation::getIndex(&local_148);
  Symbol::setParent(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4);
  Symbol::setSyntax(in_RDI,local_168);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffb00,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffaf8);
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffb30._M_extent_value;
  syntax_00._M_ptr = in_stack_fffffffffffffb28;
  Symbol::setAttributes
            (in_stack_fffffffffffffb20,
             (Scope *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),syntax_00);
  DVar3 = SemanticFacts::getDefinitionKind(local_168->kind);
  *(DefinitionKind *)&in_RDI[1].name._M_len = DVar3;
  pMVar5 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xa57f96);
  local_1c8._0_2_ = (pMVar5->lifetime).kind;
  local_1c8._2_1_ = (pMVar5->lifetime).field_0x2;
  local_1c8._3_1_ = (pMVar5->lifetime).numFlags;
  local_1c8._4_4_ = (pMVar5->lifetime).rawLen;
  pIStack_1c0 = (pMVar5->lifetime).info;
  token.rawLen = in_stack_fffffffffffffaf4;
  token.kind = (short)in_stack_fffffffffffffaf0;
  token._2_1_ = (char)((uint)in_stack_fffffffffffffaf0 >> 0x10);
  token.numFlags.raw = (char)((uint)in_stack_fffffffffffffaf0 >> 0x18);
  token.info = (Info *)in_stack_fffffffffffffaf8;
  local_1b8 = (_Optional_payload_base<slang::ast::VariableLifetime>)
              SemanticFacts::getVariableLifetime(token);
  local_1cc = 1;
  VVar4 = std::optional<slang::ast::VariableLifetime>::value_or<slang::ast::VariableLifetime>
                    ((optional<slang::ast::VariableLifetime> *)in_stack_fffffffffffffaf8,
                     (VariableLifetime *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  *(VariableLifetime *)((long)&in_RDI[1].name._M_len + 4) = VVar4;
  local_1d8 = not_null<slang::syntax::ModuleHeaderSyntax_*>::get
                        ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)&local_168[3].parent);
  SVar1.endLoc = local_210.endLoc;
  SVar1.startLoc = local_210.startLoc;
  if ((local_1d8->ports != (PortListSyntax *)0x0) &&
     (local_210 = SVar1, (local_1d8->ports->super_SyntaxNode).kind == WildcardPortList)) {
    pCVar7 = Scope::getCompilation(local_160);
    local_1f8 = (in_RDI->name)._M_len;
    pcStack_1f0 = (in_RDI->name)._M_str;
    sVar12._M_str._0_7_ = in_stack_fffffffffffffb78;
    sVar12._M_len = (size_t)in_stack_fffffffffffffb70;
    sVar12._M_str._7_1_ = in_stack_fffffffffffffb7f;
    local_1e0 = pCVar7;
    this_00 = (SourceLocation)
              Compilation::getExternDefinition
                        ((Compilation *)
                         CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),sVar12,
                         in_stack_fffffffffffffb60);
    code = SUB84((ulong)pCVar7 >> 0x20,0);
    local_1e8 = this_00;
    if ((this_00 == (SourceLocation)0x0) || (*(int *)this_00 != 0xcc)) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
      if (!bVar2) {
        local_1fc = 0x7d0006;
        local_210 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffb40);
        sourceRange.endLoc = this_00;
        sourceRange.startLoc = in_stack_fffffffffffffc30;
        Scope::addDiag(in_stack_fffffffffffffc28,code,sourceRange);
        local_228 = (in_RDI->name)._M_len;
        pcStack_220 = (in_RDI->name)._M_str;
        arg._M_len._7_1_ = in_stack_fffffffffffffb3f;
        arg._M_len._0_7_ = in_stack_fffffffffffffb38;
        arg._M_str = (char *)in_stack_fffffffffffffb40;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffb30._M_extent_value,arg);
      }
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::ExternModuleDeclSyntax>((SyntaxNode *)this_00);
      local_1d8 = not_null::operator_cast_to_ModuleHeaderSyntax_
                            ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0xa58142);
    }
  }
  in_RDI[9].originatingSyntax = &local_1d8->ports->super_SyntaxNode;
  local_3f9 = false;
  if (in_RDI[9].originatingSyntax != (SyntaxNode *)0x0) {
    local_3f9 = (in_RDI[9].originatingSyntax)->kind == NonAnsiPortList;
  }
  *(bool *)&in_RDI[0xb].location = local_3f9;
  local_229 = local_1d8->parameters != (ParameterPortListSyntax *)0x0;
  if ((bool)local_229) {
    ParameterBuilder::createDecls
              (in_stack_fffffffffffffb60,(ParameterPortListSyntax *)in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb50);
  }
  local_22a = 1;
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xa5835d);
  std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0xa5836a);
  local_268 = &local_168[3].previewNode;
  local_270._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffae8);
  local_278 = (MemberSyntax **)
              std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                        ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                         in_stack_fffffffffffffaf8);
  iVar10.index = in_stack_fffffffffffffbd0;
  iVar10.list = in_stack_fffffffffffffbd8;
  iVar11.index = in_stack_fffffffffffffbc0;
  iVar11.list = in_stack_fffffffffffffbc8;
  do {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffae8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._8_7_ = in_stack_fffffffffffffbb8;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)in_stack_fffffffffffffbb0;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._15_1_ = in_stack_fffffffffffffbbf
      ;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_8_ = iVar11.index;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           (SourceLocation)iVar10.index;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)iVar11.list;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._16_8_ = iVar10.list;
      SemanticFacts::populateTimeScale
                ((optional<slang::TimeScale> *)in_stack_fffffffffffffb98,
                 (Scope *)in_stack_fffffffffffffb90,
                 (_Optional_base<slang::TimeScale,_true,_true>)
                 SUB85((ulong)in_stack_fffffffffffffba0 >> 0x18,0),unitsRange_00,precisionRange_00);
      return;
    }
    ppMVar8 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_270);
    local_280 = *ppMVar8;
    if ((local_280->super_SyntaxNode).kind == TimeUnitsDeclaration) {
      bVar2 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0xa5840d);
      if (!bVar2) {
        std::optional<slang::TimeScale>::emplace<>
                  ((optional<slang::TimeScale> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      }
      std::optional<slang::TimeScale>::operator*((optional<slang::TimeScale> *)0xa58433);
      slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                (&local_280->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                (in_stack_fffffffffffffba0,(Scope *)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,(optional<slang::SourceRange> *)in_stack_fffffffffffffb88
                 ,(optional<slang::SourceRange> *)in_stack_fffffffffffffb80._M_extent_value,
                 (bool)in_stack_fffffffffffffb7f);
    }
    else {
      local_22a = 0;
      if ((local_280->super_SyntaxNode).kind == ModportDeclaration) {
        pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                           (&local_280->super_SyntaxNode);
        local_288 = &pMVar9->items;
        iVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0xa584f7);
        local_298 = iVar10;
        iVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)
                            CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
        local_2a8 = iVar11;
        while( true ) {
          in_stack_fffffffffffffbbf =
               operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>_>
                         ((self_type *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)
                          ,(iterator_base<slang::syntax::ModportItemSyntax_*> *)
                           in_stack_fffffffffffffae8);
          if (((in_stack_fffffffffffffbbf ^ 0xff) & 1) == 0) break;
          in_stack_fffffffffffffbb0 =
               iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
                            *)0xa585a5);
          in_stack_fffffffffffffb70 = in_RDI + 10;
          local_2b0 = in_stack_fffffffffffffbb0;
          sVar12 = parsing::Token::valueText((Token *)in_stack_fffffffffffffb00);
          in_stack_fffffffffffffba0 = (TimeScale *)sVar12._M_str;
          local_138 = &local_2c0;
          in_stack_fffffffffffffb98 = in_stack_fffffffffffffb70;
          local_130 = in_stack_fffffffffffffb70;
          local_128 = local_138;
          local_120 = in_stack_fffffffffffffb70;
          local_70 = local_138;
          local_68 = in_stack_fffffffffffffb70;
          local_2c0 = sVar12;
          in_stack_fffffffffffffb90 =
               (TimeUnitsDeclarationSyntax *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_string_view<char,_std::char_traits<char>_> *)0xa58695);
          local_78 = in_stack_fffffffffffffb90;
          in_stack_fffffffffffffb80._M_extent_value =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          in_stack_fffffffffffffae8);
          local_80 = (optional<slang::SourceRange> *)in_stack_fffffffffffffb80._M_extent_value;
          local_88 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)
                                    ,(size_t)in_stack_fffffffffffffae8);
          in_stack_fffffffffffffb78 = (undefined7)local_88;
          in_stack_fffffffffffffb7f = (undefined1)(local_88 >> 0x38);
          local_10 = local_78;
          local_20 = local_80;
          in_stack_fffffffffffffb88 = in_stack_fffffffffffffb70;
          local_18 = local_88;
          local_8 = in_stack_fffffffffffffb70;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_30,local_88);
          do {
            local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
            local_40 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)0xa58794);
            local_40 = local_40 + local_38;
            in_stack_fffffffffffffb6c =
                 boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffaf8,
                            CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
            local_44 = in_stack_fffffffffffffb6c;
            if (in_stack_fffffffffffffb6c != 0) {
              local_50 = boost::unordered::detail::foa::
                         table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     *)0xa587f2);
              local_58 = local_50 + local_38 * 0xf;
              do {
                local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                in_stack_fffffffffffffb50 =
                     (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)
                     boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)0xa58845);
                in_stack_fffffffffffffb58 = local_10;
                in_stack_fffffffffffffb60 =
                     (Scope *)boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                              ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         0xa58872);
                bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffffb00);
                if (bVar2) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                  goto LAB_00a5897c;
                }
                local_44 = local_44 - 1 & local_44;
              } while (local_44 != 0);
            }
            bVar2 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                               (size_t)in_stack_fffffffffffffae8);
            if (bVar2) {
              memset(&local_a0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::table_locator(&local_a0);
              goto LAB_00a5897c;
            }
            bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_30,(in_stack_fffffffffffffb70->name)._M_len);
          } while (bVar2);
          memset(&local_a0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::table_locator(&local_a0);
LAB_00a5897c:
          bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_a0);
          if (bVar2) {
            local_b0 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::make_iterator((locator *)0xa5899e);
            local_b1 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_2d8,&local_b0,&local_b1);
          }
          else if (in_stack_fffffffffffffb88->nextInScope <
                   (Symbol *)in_stack_fffffffffffffb88->parentScope) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                      (in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                       (size_t)in_stack_fffffffffffffb00,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffaf8
                      );
            local_c8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::make_iterator((locator *)0xa58a26);
            local_e1[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_2d8,&local_c8,local_e1);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                      ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb50
                      );
            local_f8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::make_iterator((locator *)0xa58a91);
            local_111[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_2d8,&local_f8,local_111);
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
        }
      }
      else if ((local_280->super_SyntaxNode).kind == ParameterDeclarationStatement) {
        slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationStatementSyntax>
                  (&local_280->super_SyntaxNode);
        not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::
        not_null<slang::not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>_&>
                  ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                   (not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)
                   in_stack_fffffffffffffae8);
        if ((local_229 & 1) == 0) {
          not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator->
                    ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)0xa58b44);
        }
        not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator*
                  ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)0xa58b84);
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)in_stack_fffffffffffffb00,
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffae8 =
             (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[1].parentScope;
        attributes._M_ptr._7_1_ = in_stack_fffffffffffffb7f;
        attributes._M_ptr._0_7_ = in_stack_fffffffffffffb78;
        attributes._M_extent._M_extent_value = in_stack_fffffffffffffb80._M_extent_value;
        ParameterBuilder::createDecls
                  ((Scope *)in_stack_fffffffffffffb70,
                   (ParameterDeclarationBaseSyntax *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   SUB81((ulong)in_stack_fffffffffffffb60 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffffb60 >> 0x30,0),attributes,
                   (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)
                   in_stack_fffffffffffffb90);
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_270);
  } while( true );
}

Assistant:

DefinitionSymbol::DefinitionSymbol(const Scope& scope, LookupLocation lookupLocation,
                                   const ModuleDeclarationSyntax& syntax,
                                   const NetType& defaultNetType, UnconnectedDrive unconnectedDrive,
                                   bool cellDefine, std::optional<TimeScale> directiveTimeScale,
                                   const SyntaxTree* syntaxTree) :
    Symbol(SymbolKind::Definition, syntax.header->name.valueText(), syntax.header->name.location()),
    defaultNetType(defaultNetType), unconnectedDrive(unconnectedDrive), cellDefine(cellDefine),
    syntaxTree(syntaxTree), sourceLibrary(getLibForDef(scope, syntaxTree)) {

    // Extract and save various properties of the definition.
    setParent(scope, lookupLocation.getIndex());
    setSyntax(syntax);
    setAttributes(scope, syntax.attributes);

    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime)
                          .value_or(VariableLifetime::Static);

    auto header = syntax.header.get();
    if (header->ports && header->ports->kind == SyntaxKind::WildcardPortList) {
        auto& comp = scope.getCompilation();
        auto externMod = comp.getExternDefinition(name, scope);
        if (externMod && externMod->kind == SyntaxKind::ExternModuleDecl)
            header = externMod->as<ExternModuleDeclSyntax>().header;
        else if (!name.empty())
            scope.addDiag(diag::MissingExternWildcardPorts, header->ports->sourceRange()) << name;
    }

    portList = header->ports;
    hasNonAnsiPorts = portList && portList->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header->parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header->parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!timeScale)
                timeScale.emplace();

            SemanticFacts::populateTimeScale(*timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          member->attributes, parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
}